

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

Ref<Lodtalk::MethodASTHandle> * __thiscall Lodtalk::AST::MethodAST::getHandle(MethodAST *this)

{
  bool bVar1;
  MethodASTHandle *pointer;
  MethodAST *this_local;
  
  bVar1 = Ref<Lodtalk::MethodASTHandle>::isNil(&this->astHandle);
  if (bVar1) {
    pointer = MethodASTHandle::basicNativeNew(this->context,this);
    Ref<Lodtalk::MethodASTHandle>::reset(&this->astHandle,pointer);
  }
  return &this->astHandle;
}

Assistant:

const Ref<MethodASTHandle> &MethodAST::getHandle()
{
	if(astHandle.isNil())
		astHandle.reset(MethodASTHandle::basicNativeNew(context, this));

	return astHandle;
}